

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *this,TPZCompMesh *mesh,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  int64_t in_RDX;
  TPZManVector<TPZCompElSide,_5> *in_RSI;
  TPZMultiphysicsElement *in_RDI;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  int in_stack_ffffffffffffff8c;
  pointer_____offset_0x60___ *vtt;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  vtt = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_025016b0);
  TPZMultiphysicsElement::TPZMultiphysicsElement(in_RDI,vtt);
  *(undefined ***)&in_RDI->super_TPZCompEl = &PTR__TPZMultiphysicsCompEl_02501378;
  *(undefined ***)&in_RDI->super_TPZCompEl = &PTR__TPZMultiphysicsCompEl_02501378;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(in_RSI,in_RDX);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI[1].fActiveApproxSpace.fExtAlloc + 4));
  TPZInt1Point::TPZInt1Point
            ((TPZInt1Point *)&in_RDI[2].super_TPZCompEl.fReferenceIndex,in_stack_ffffffffffffff8c);
  pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh,
                                                        const TPZMultiphysicsCompEl<TGeometry> &copy,
                                                        std::map<int64_t,int64_t> & gl2lcConMap,
                                                        std::map<int64_t,int64_t> & gl2lcElMap) : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId){
    
    DebugStop(); // if this is called, withmem should not work
}